

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

bool __thiscall
Memory::Recycler::ProcessObjectBeforeCollectCallbacks(Recycler *this,bool atShutdown)

{
  RealCount *pRVar1;
  ObjectBeforeCollectCallbackList *pOVar2;
  void *address;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  ObjectBeforeCollectCallbackList *pOVar3;
  code *pcVar4;
  Type pSVar5;
  Type pSVar6;
  Type pSVar7;
  SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
  *buffer;
  undefined1 auVar8 [8];
  bool bVar9;
  undefined4 *puVar10;
  Type *pTVar11;
  undefined7 extraout_var;
  SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
  **ppSVar12;
  SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
  *pSVar13;
  Type pSVar14;
  undefined1 local_98 [8];
  EditingIterator iter;
  AutoRestoreValue<Memory::Recycler::ObjectBeforeCollectCallbackState>
  autoInObjectBeforeCollectCallback;
  Iterator local_60;
  undefined1 local_50 [8];
  AutoAllocatorObjectPtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>,_Memory::ArenaAllocator>
  oldCallbackList;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  pOVar2 = this->objectBeforeCollectCallbackList;
  if (pOVar2 == (ObjectBeforeCollectCallbackList *)0x0) goto LAB_0070fd5b;
  if ((!atShutdown) &&
     (((this->collectionState).value & CollectionStateMark) == CollectionStateNotCollecting)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x2345,"(atShutdown || this->IsMarkState())",
                       "atShutdown || this->IsMarkState()");
    if (!bVar9) goto LAB_0070fe00;
    *puVar10 = 0;
  }
  if (this->objectBeforeCollectCallbackState != ObjectBeforeCollectCallback_None) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x2347,"(!this->IsInObjectBeforeCollectCallback())",
                       "!this->IsInObjectBeforeCollectCallback()");
    if (!bVar9) {
LAB_0070fe00:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar10 = 0;
  }
  iter.super_EditingIterator.last._0_4_ = atShutdown + ObjectBeforeCollectCallback_Normal;
  this->objectBeforeCollectCallbackState =
       (ObjectBeforeCollectCallbackState)iter.super_EditingIterator.last;
  local_50 = (undefined1  [8])this->objectBeforeCollectCallbackList;
  oldCallbackList.
  super_BasePtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>_>
  .ptr = (SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
          *)&this->objectBeforeCollectCallbackArena;
  this->objectBeforeCollectCallbackList = (ObjectBeforeCollectCallbackList *)0x0;
  local_98 = (undefined1  [8])
             BasePtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>_>
             ::operator->((BasePtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>_>
                           *)local_50);
  iter.super_EditingIterator.super_Iterator.current = (NodeBase *)0x0;
  oldCallbackList.m_allocator._4_4_ = 0;
  iter.super_EditingIterator.super_Iterator.list =
       (SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
        *)local_98;
LAB_0070fb64:
  do {
    bVar9 = SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
            ::EditingIterator::Next((EditingIterator *)local_98);
    auVar8 = local_50;
    if (!bVar9) break;
    pTVar11 = SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
              ::Iterator::Data((Iterator *)local_98);
    if (pTVar11->callback != (ObjectBeforeCollectCallback)0x0) {
      address = pTVar11->object;
      if ((!atShutdown) && (bVar9 = HeapBlockMap64::IsMarked(&this->heapBlockMap,address), bVar9)) {
        oldCallbackList.m_allocator._4_4_ = (uint)CONCAT71(extraout_var,1);
        goto LAB_0070fb64;
      }
      if (pTVar11->callbackWrapper == (ObjectBeforeCollectCallbackWrapper)0x0) {
        (*pTVar11->callback)(address,pTVar11->callbackState);
      }
      else {
        (*pTVar11->callbackWrapper)
                  (pTVar11->callback,address,pTVar11->callbackState,pTVar11->threadContext);
      }
    }
    buffer = iter.super_EditingIterator.super_Iterator.list;
    this_00 = *(ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> **)
               ((long)local_98 + 0x10);
    SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
    ::EditingIterator::UnlinkCurrentNode((EditingIterator *)local_98);
    ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free(this_00,buffer,0x30);
  } while( true );
  if ((oldCallbackList.m_allocator._4_4_ & 1) != 0) {
    pSVar13 = this->objectBeforeCollectCallbackList;
    local_50 = (undefined1  [8])0x0;
    if (pSVar13 ==
        (SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
         *)0x0) {
      this->objectBeforeCollectCallbackList = (ObjectBeforeCollectCallbackList *)auVar8;
    }
    else {
      ppSVar12 = BasePtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>_>
                 ::operator&((BasePtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>_>
                              *)local_50);
      *ppSVar12 = pSVar13;
      this->objectBeforeCollectCallbackList = (ObjectBeforeCollectCallbackList *)auVar8;
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                ((AutoNestedHandledExceptionType *)&oldCallbackList.m_allocator,
                 ExceptionType_OutOfMemory);
      pSVar13 = BasePtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>_>
                ::operator->((BasePtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>_>
                              *)local_50);
      local_60.list =
           &pSVar13->
            super_SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
      ;
      local_60.current = (NodeBase *)pSVar13;
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      while( true ) {
        if (pSVar13 ==
            (SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
             *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar10 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar9) goto LAB_0070fe00;
          *puVar10 = 0;
          pSVar13 = (SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
                     *)local_60.current;
        }
        pSVar13 = (SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
                   *)(pSVar13->
                     super_SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
                     ).super_SListNodeBase<Memory::ArenaAllocator>.next;
        if (pSVar13 ==
            (SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
             *)local_60.list) break;
        local_60.current = (NodeBase *)pSVar13;
        pTVar11 = SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
                  ::Iterator::Data(&local_60);
        pOVar3 = this->objectBeforeCollectCallbackList;
        pSVar14 = (Type)new<Memory::ArenaAllocator>(0x30,pOVar3->allocator,0x364470);
        pSVar14[5].next = (Type)pTVar11->callbackWrapper;
        pSVar5 = (Type)pTVar11->object;
        pSVar6 = (Type)pTVar11->callback;
        pSVar7 = (Type)pTVar11->threadContext;
        pSVar14[3].next = (Type)pTVar11->callbackState;
        pSVar14[4].next = pSVar7;
        pSVar14[1].next = pSVar5;
        pSVar14[2].next = pSVar6;
        pSVar14->next =
             (pOVar3->
             super_SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
             ).super_SListNodeBase<Memory::ArenaAllocator>.next;
        (pOVar3->
        super_SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
        ).super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar14;
        pRVar1 = &(pOVar3->
                  super_SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
                  ).super_RealCount;
        pRVar1->count = pRVar1->count + 1;
        pSVar13 = (SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
                   *)local_60.current;
      }
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
                ((AutoNestedHandledExceptionType *)&oldCallbackList.m_allocator);
    }
  }
  AutoAllocatorObjectPtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>,_Memory::ArenaAllocator>
  ::Clear((AutoAllocatorObjectPtr<SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>,_Memory::ArenaAllocator>
           *)local_50);
  AutoRestoreValue<Memory::Recycler::ObjectBeforeCollectCallbackState>::~AutoRestoreValue
            ((AutoRestoreValue<Memory::Recycler::ObjectBeforeCollectCallbackState> *)
             &iter.super_EditingIterator.last);
LAB_0070fd5b:
  return pOVar2 != (ObjectBeforeCollectCallbackList *)0x0;
}

Assistant:

bool Recycler::ProcessObjectBeforeCollectCallbacks(bool atShutdown/*= false*/)
{
    if (this->objectBeforeCollectCallbackList == nullptr)
    {
        return false; // no callbacks
    }
    Assert(atShutdown || this->IsMarkState());

    Assert(!this->IsInObjectBeforeCollectCallback());
    AutoRestoreValue<ObjectBeforeCollectCallbackState> autoInObjectBeforeCollectCallback(&objectBeforeCollectCallbackState,
        atShutdown ? ObjectBeforeCollectCallback_Shutdown : ObjectBeforeCollectCallback_Normal);

    // The callbacks may register/unregister callbacks while we are enumerating the current map. To avoid
    // conflicting usage of the callback map, we swap it out. New registration will go to a new map.
    AutoAllocatorObjectPtr<ObjectBeforeCollectCallbackList, ArenaAllocator> oldCallbackList(
        this->objectBeforeCollectCallbackList, &this->objectBeforeCollectCallbackArena);
    this->objectBeforeCollectCallbackList = nullptr;

    bool hasRemainingCallbacks = false;
    FOREACH_SLIST_ENTRY_EDITING(ObjectBeforeCollectCallbackData, data, oldCallbackList, iter)
    {
        bool remove = true;
        if (data.callback != nullptr)
        {
            void* object = data.object;
            if (atShutdown || !this->IsObjectMarked(object))
            {
                if (data.callbackWrapper != nullptr)
                {
                    data.callbackWrapper(data.callback, object, data.callbackState, data.threadContext);
                }
                else
                {
                    data.callback(object, data.callbackState);
                }
            }
            else
            {
                hasRemainingCallbacks = true;
                remove = false; // Do not remove this entry, remaining callback for future
            }
        }
        if (remove)
        {
            iter.RemoveCurrent();
        }
    } NEXT_SLIST_ENTRY_EDITING;

    // Merge back remaining callbacks if any
    if (hasRemainingCallbacks)
    {
        if (this->objectBeforeCollectCallbackList == nullptr)
        {
            this->objectBeforeCollectCallbackList = oldCallbackList.Detach();
        }
        else
        {
            // Swap back, since old list is likely larger
            ObjectBeforeCollectCallbackList* tmp = oldCallbackList.Detach();
            *&oldCallbackList = this->objectBeforeCollectCallbackList;
            this->objectBeforeCollectCallbackList = tmp;

            try
            {
                AUTO_NESTED_HANDLED_EXCEPTION_TYPE(ExceptionType_OutOfMemory);
                oldCallbackList->Map([&](const ObjectBeforeCollectCallbackData& data)
                {
                    this->objectBeforeCollectCallbackList->Push(data);
                });
            }
            catch (Js::OutOfMemoryException)
            {
                // can't recover from OOM here
                AssertOrFailFast(UNREACHED);
            }
        }
    }

    return true; // maybe called callbacks
}